

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O3

json * __thiscall
nanojson3::json::json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::read_number
          (json *__return_storage_ptr__,
          json_reader<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this)

{
  int_type iVar1;
  int_type iVar2;
  int iVar3;
  uint __value;
  uint uVar4;
  char *__last;
  bad_format *pbVar5;
  char *__last_00;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  longdouble lVar9;
  __integer_from_chars_result_type<int> _Var10;
  __integer_from_chars_result_type<long_long> _Var11;
  __integer_to_chars_result_type<int> _Var12;
  string_view reason;
  string_view reason_00;
  string_view reason_01;
  string_view reason_02;
  string_view reason_03;
  undefined1 auVar13 [12];
  int exp_value;
  char exp_part [32];
  char buffer [128];
  int local_e4;
  json *local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined2 uStack_d0;
  undefined6 uStack_ce;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  char local_38 [8];
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  iVar1 = input_stream::peek(&this->input_);
  if (iVar1 == 0x2d) {
    input_stream::eat(&this->input_);
    local_b8 = CONCAT71(local_b8._1_7_,0x2d);
  }
  uVar6 = (ulong)(iVar1 == 0x2d);
  if (((this->option_bits_ & allow_number_with_plus_sign) != none) &&
     (iVar1 = input_stream::peek(&this->input_), iVar1 == 0x2b)) {
    input_stream::eat(&this->input_);
  }
  iVar1 = input_stream::peek(&this->input_);
  if (iVar1 == 0x30) {
    input_stream::eat(&this->input_);
    *(undefined1 *)((long)&local_b8 + uVar6) = 0x30;
    uVar6 = uVar6 + 1;
    uVar4 = 0;
  }
  else {
    iVar1 = input_stream::peek(&this->input_);
    if (9 < iVar1 - 0x30U) {
      pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
      uVar4 = input_stream::peek(&this->input_);
      reason_01._M_str = "invalid number format: expected a digit";
      reason_01._M_len = 0x27;
      bad_format(pbVar5,this,reason_01,(optional<int>)((ulong)uVar4 | 0x100000000));
      goto LAB_0010a7b1;
    }
    iVar1 = input_stream::peek(&this->input_);
    uVar4 = 0;
    if (iVar1 - 0x30U < 10) {
      uVar4 = 0;
      do {
        if ((long)uVar6 < 0x3c) {
          iVar1 = input_stream::eat(&this->input_);
          *(char *)((long)&local_b8 + uVar6) = (char)iVar1;
          uVar6 = uVar6 + 1;
        }
        else {
          if (uVar4 == 0x7fffffff) {
            pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
            reason._M_str = "invalid number format: too long integer sequence";
            reason._M_len = 0x30;
            bad_format(pbVar5,this,reason,(optional<int>)0x0);
            goto LAB_0010a7b1;
          }
          uVar4 = uVar4 + 1;
          input_stream::eat(&this->input_);
        }
        iVar1 = input_stream::peek(&this->input_);
      } while (iVar1 - 0x30U < 10);
    }
  }
  iVar1 = input_stream::peek(&this->input_);
  if (iVar1 == 0x2e) {
    input_stream::eat(&this->input_);
    if (0x3f < (long)uVar6) {
      __assert_fail("p < fraction_limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                    ,0x3fa,
                    "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                   );
    }
    *(undefined1 *)((long)&local_b8 + uVar6) = 0x2e;
    iVar2 = input_stream::peek(&this->input_);
    if (9 < iVar2 - 0x30U) {
      pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
      uVar4 = input_stream::peek(&this->input_);
      reason_02._M_str = "invalid number format: expected a digit";
      reason_02._M_len = 0x27;
      bad_format(pbVar5,this,reason_02,(optional<int>)((ulong)uVar4 | 0x100000000));
      goto LAB_0010a7b1;
    }
    if (((char)local_b8 == '0') || (((char)local_b8 == '-' && (local_b8._1_1_ == '0')))) {
      while (iVar2 = input_stream::peek(&this->input_), iVar2 == 0x30) {
        uVar4 = uVar4 - 1;
        input_stream::eat(&this->input_);
      }
    }
    uVar6 = uVar6 + 1;
    iVar3 = input_stream::peek(&this->input_);
    while (iVar3 - 0x30U < 10) {
      if ((long)uVar6 < 0x40) {
        iVar2 = input_stream::eat(&this->input_);
        *(char *)((long)&local_b8 + uVar6) = (char)iVar2;
        uVar6 = uVar6 + 1;
      }
      else {
        input_stream::eat(&this->input_);
      }
      iVar3 = input_stream::peek(&this->input_);
    }
  }
  __last = (char *)((long)&local_b8 + uVar6);
  iVar2 = input_stream::peek(&this->input_);
  local_e0 = __return_storage_ptr__;
  if ((iVar2 == 0x65) || (iVar2 = input_stream::peek(&this->input_), iVar2 == 0x45)) {
    input_stream::eat(&this->input_);
    local_c8 = 0;
    uStack_c0 = 0;
    local_d8 = '\0';
    uStack_d7 = 0;
    uStack_d0 = 0;
    uStack_ce = 0;
    iVar1 = input_stream::peek(&this->input_);
    if (iVar1 == 0x2d) {
      __last_00 = (char *)&uStack_d7;
      input_stream::eat(&this->input_);
      local_d8 = '-';
      lVar7 = 1;
    }
    else {
      iVar1 = input_stream::peek(&this->input_);
      __last_00 = &local_d8;
      if (iVar1 == 0x2b) {
        input_stream::eat(&this->input_);
      }
      lVar7 = 0;
    }
    iVar1 = input_stream::peek(&this->input_);
    if (9 < iVar1 - 0x30U) {
      pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
      uVar4 = input_stream::peek(&this->input_);
      reason_00._M_str = "invalid number format: expected a digit";
      reason_00._M_len = 0x27;
      bad_format(pbVar5,this,reason_00,(optional<int>)((ulong)uVar4 | 0x100000000));
      __cxa_throw(pbVar5,&exceptions::bad_format::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3 = input_stream::peek(&this->input_);
    while (iVar3 - 0x30U < 10) {
      iVar1 = input_stream::eat(&this->input_);
      if (lVar7 < 0x20) {
        lVar7 = lVar7 + 1;
        *__last_00 = (char)iVar1;
      }
      __last_00 = &local_d8 + lVar7;
      iVar3 = input_stream::peek(&this->input_);
    }
    local_e4 = 0;
    _Var10 = std::from_chars<int>(&local_d8,__last_00,&local_e4,10);
    if ((_Var10.ec == 0) && (_Var10.ptr == __last_00)) {
      if ((int)uVar4 < 1) {
        __value = 0x80000000;
        if (uVar4 == 0 || (int)(-0x80000000 - uVar4) <= local_e4) goto LAB_0010a611;
      }
      else if ((int)(uVar4 ^ 0x7fffffff) < local_e4) {
        __value = 0x7fffffff;
      }
      else {
LAB_0010a611:
        bVar8 = true;
        __value = uVar4 + local_e4;
        if (uVar4 + local_e4 == 0) goto LAB_0010a61c;
      }
    }
    else {
      if ((_Var10.ec != result_out_of_range) || (_Var10.ptr != __last_00)) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                      ,0x437,
                      "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                     );
      }
      __value = (local_d8 != '-') + 0x7fffffff;
    }
  }
  else {
    __value = uVar4;
    if (uVar4 == 0) {
      bVar8 = true;
      if (iVar1 != 0x2e) {
        local_d8 = '\0';
        uStack_d7 = 0;
        _Var11 = std::from_chars<long_long>((char *)&local_b8,__last,(longlong *)&local_d8,10);
        if (_Var11.ptr == __last && _Var11.ec == 0) {
          *(ulong *)&(local_e0->value_).
                     super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                     .
                     super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                     .
                     super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                     .
                     super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                     .
                     super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                     .
                     super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
               = CONCAT71(uStack_d7,local_d8);
          *(__index_type *)
           ((long)&(local_e0->value_).
                   super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
                   .
                   super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                   .
                   super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                   .
                   super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                   .
                   super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
                   .
                   super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           + 0x20) = '\x03';
          return local_e0;
        }
      }
      goto LAB_0010a61c;
    }
  }
  if (0x7f < (long)uVar6) {
    __assert_fail("p < decimal_limit",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                  ,0x43f,
                  "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                 );
  }
  *__last = 'e';
  _Var12 = std::__to_chars_i<int>((char *)((long)&local_b8 + uVar6 + 1),local_38,__value,10);
  __last = _Var12.ptr;
  if (_Var12.ec != 0) {
    pbVar5 = (bad_format *)__cxa_allocate_exception(0x10);
    reason_03._M_str = "invalid number format: unexpected error.";
    reason_03._M_len = 0x28;
    bad_format(pbVar5,this,reason_03,(optional<int>)0x0);
LAB_0010a7b1:
    __cxa_throw(pbVar5,&exceptions::bad_format::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar8 = -1 < (int)__value;
LAB_0010a61c:
  lVar9 = (longdouble)0;
  local_d8 = SUB101(lVar9,0);
  uStack_d7 = (undefined7)((unkuint10)lVar9 >> 8);
  uStack_d0 = (undefined2)((unkuint10)lVar9 >> 0x40);
  auVar13 = std::from_chars((char *)&local_b8,__last,(longdouble *)&local_d8,general);
  iVar3 = auVar13._8_4_;
  if ((iVar3 != 0) && (iVar3 != 0x22)) {
    __assert_fail("ec == std::errc{} || ec == std::errc::result_out_of_range",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                  ,0x45b,
                  "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                 );
  }
  if (auVar13._0_8_ != __last) {
    __assert_fail("ptr == p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                  ,0x45c,
                  "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                 );
  }
  lVar9 = (longdouble)0;
  if (iVar3 == 0x22) {
    if (bVar8) {
      lVar9 = *(longdouble *)(&DAT_001130b0 + (ulong)((char)local_b8 == '-') * 0x10);
    }
  }
  else {
    if (iVar3 != 0) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ttsuki[P]nanojson/nanojson3.h"
                    ,0x469,
                    "json nanojson3::json::json_reader<std::istreambuf_iterator<char>>::read_number() [CharInputIterator = std::istreambuf_iterator<char>]"
                   );
    }
    lVar9 = (longdouble)CONCAT28(uStack_d0,CONCAT71(uStack_d7,local_d8));
  }
  *(longdouble *)
   &(local_e0->value_).
    super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
    .
    super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
    .
    super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
    .
    super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
    .
    super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
    .
    super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
       = lVar9;
  *(__index_type *)
   ((long)&(local_e0->value_).
           super__Variant_base<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<nanojson3::json,_std::allocator<nanojson3::json>_>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json,_std::equal_to<void>,_std::vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nanojson3::json>_>_>_>_>
           .
           super__Move_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           .
           super__Copy_assign_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           .
           super__Move_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           .
           super__Copy_ctor_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
           .
           super__Variant_storage_alias<std::monostate,_std::nullptr_t,_bool,_long_long,_long_double,_std::__cxx11::basic_string<char>,_std::vector<nanojson3::json>,_nanojson3::internal::key_value_store<std::__cxx11::basic_string<char>,_nanojson3::json,_std::equal_to<void>_>_>
   + 0x20) = '\x04';
  return local_e0;
}

Assistant:

json read_number()
        {
            constexpr auto is_digit = [](int_type i)-> bool { return i >= '0' && i <= '9'; }; // locale-independent is_digit

            char buffer[128]{};
            char* p = buffer;
            char* const integer_limit = buffer + 60;
            char* const fraction_limit = buffer + 64;
            char* const decimal_limit = buffer + 128;

            int exp_offset = 0;
            constexpr auto maximum_exp_offset = (std::numeric_limits<decltype(exp_offset)>::max)();
            constexpr auto minimum_exp_offset = (std::numeric_limits<decltype(exp_offset)>::lowest)();

            bool integer_type = true;

            // parse integer part
            {
                if (input_.eat('-')) { *p++ = '-'; }                                                  // minus sign
                if (has_option(json_parse_option::allow_number_with_plus_sign) && input_.eat('+')) {} // ignore plus sign

                if (input_.eat('0')) { *p++ = '0'; } // put '0', leading zeros are not allowed in JSON.
                else if (is_digit(*input_))          // not zero
                {
                    while (is_digit(*input_))
                        if (p < integer_limit) *p++ = static_cast<char_type>(*input_++);  // put digit
                        else if (exp_offset < maximum_exp_offset) ++exp_offset, ++input_; // drop digit
                        else throw bad_format("invalid number format: too long integer sequence");
                }
                else throw bad_format("invalid number format: expected a digit", *input_);
            }

            if (input_.eat('.')) // accept fraction point part
            {
                assert(p < fraction_limit);
                *p++ = '.'; // put decimal point
                integer_type = false;

                if (is_digit(*input_))
                {
                    // if integer part is zero (parse '-0.0000...ddd')
                    if ((buffer[0] == '0') || (buffer[0] == '-' && buffer[1] == '0'))
                    {
                        while (*input_ == '0')
                            if (exp_offset > minimum_exp_offset) --exp_offset, ++input_; // drop '0'
                            else throw bad_format("invalid number format: too long integer sequence");
                    }

                    while (is_digit(*input_))
                    {
                        if (p < fraction_limit) *p++ = static_cast<char_type>(*input_++); // put digit
                        else ++input_;                                                    // drop digit
                    }
                }
                else throw bad_format("invalid number format: expected a digit", *input_);
            }

            if (*input_ == 'e' || *input_ == 'E') // accept exponent part
            {
                ++input_; // 'e'
                integer_type = false;

                char exp_part[32]{};
                char* exp = exp_part;
                char* const exp_limit = exp_part + std::size(exp_part);

                // read

                if (input_.eat('-')) { *exp++ = '-'; }
                else if (input_.eat('+')) {} // drop '+'

                if (is_digit(*input_))
                {
                    while (is_digit(*input_))
                    {
                        if (exp < exp_limit) *exp++ = static_cast<char_type>(*input_++); // put digit
                        else ++input_;                                                   // drop digit (it must be overflow, handle later)
                    }
                }
                else throw bad_format("invalid number format: expected a digit", *input_);

                // parse exponent
                int exp_value{};
                auto [ptr, ec] = std::from_chars(exp_part, exp, exp_value, 10);

                if (ec == std::errc{} && ptr == exp)
                {
                    exp_offset = exp_offset > 0 && exp_value > maximum_exp_offset - exp_offset ? maximum_exp_offset : exp_offset < 0 && exp_value < minimum_exp_offset - exp_offset ? minimum_exp_offset : exp_offset + exp_value;
                }
                else if (ec == std::errc::result_out_of_range && ptr == exp)
                {
                    exp_offset = exp_part[0] == '-' ? maximum_exp_offset : minimum_exp_offset;
                }
                else // other error (bug)
                {
                    assert(false);
                    throw bad_format("invalid number format: unexpected parse error "); // unexpected
                }
            }

            if (exp_offset != 0) // append parsed exponent part to buffer
            {
                integer_type = false;
                assert(p < decimal_limit);
                if (p < decimal_limit) *p++ = 'e';
                auto [ptr, ec] = std::to_chars(p, decimal_limit, exp_offset, 10);
                if (ec != std::errc{}) throw bad_format("invalid number format: unexpected error.");
                p = ptr;
            }

            // try to parse as integer type
            if (integer_type)
            {
                json::js_integer ret{};
                auto [ptr, ec] = std::from_chars(buffer, p, ret, 10);
                if (ec == std::errc{} && ptr == p) return json{in_place_index::integer, ret}; // integer OK
            }

            // try to parse as floating type (should succeed)
            {
                json::js_floating ret{};
#if (defined(__cpp_lib_to_chars) && __cpp_lib_to_chars >= 201611L) // compiler has floating-point from_chars
                auto [ptr, ec] = std::from_chars(buffer, p, ret);
#else // use fallback implementation
                std::istringstream tmp{std::string(buffer, p)};
                tmp.imbue(std::locale::classic());
                tmp >> ret;
                std::errc ec = !tmp ? std::errc::result_out_of_range : std::errc{}; // if fails, assume it must be out of range.
                const char* ptr = !tmp ? p : tmp.eof() ? p : buffer + tmp.tellg();
#endif

                assert(ec == std::errc{} || ec == std::errc::result_out_of_range);
                assert(ptr == p);

                if (ptr == p && ec == std::errc{}) return json{in_place_index::floating, ret}; // floating OK

                if (ec == std::errc::result_out_of_range) // overflow or underflow
                {
                    if (exp_offset >= 0) // overflow
                        return json{in_place_index::floating, buffer[0] != '-' ? +std::numeric_limits<json::js_floating>::infinity() : -std::numeric_limits<json::js_floating>::infinity()};
                    else // underflow
                        return json{in_place_index::floating, buffer[0] != '-' ? +static_cast<json::js_floating>(+0.0) : -static_cast<json::js_floating>(-0.0)};
                }
            }

            assert(false);
            throw bad_format("invalid number format: failed to parse");
        }